

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O2

float __thiscall nv::Filter::sampleTriangle(Filter *this,float x,float scale,int samples)

{
  int iVar1;
  int iVar2;
  float extraout_XMM0_Da;
  float fVar3;
  float fVar4;
  undefined1 in_XMM2 [16];
  undefined1 auVar5 [16];
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  iVar2 = 0;
  iVar1 = samples;
  if (samples < 1) {
    iVar1 = 0;
  }
  fVar3 = 0.0;
  for (; iVar1 != iVar2; iVar2 = iVar2 + 1) {
    fVar4 = ((float)iVar2 + (float)iVar2 + 1.0) * (1.0 / (float)samples);
    (*this->_vptr_Filter[2])((fVar4 + x + -0.5) * scale,this);
    uStack_34 = in_XMM2._4_4_;
    uStack_30 = in_XMM2._8_4_;
    uStack_2c = in_XMM2._12_4_;
    auVar5._0_4_ = ~-(uint)(1.0 < fVar4) & (uint)fVar4;
    auVar5._4_4_ = uStack_34;
    auVar5._8_4_ = uStack_30;
    auVar5._12_4_ = uStack_2c;
    auVar5 = auVar5 | ZEXT416((uint)(2.0 - fVar4) & -(uint)(1.0 < fVar4));
    in_XMM2._4_12_ = auVar5._4_12_;
    in_XMM2._0_4_ = auVar5._0_4_ * extraout_XMM0_Da;
    fVar3 = fVar3 + in_XMM2._0_4_;
  }
  return (1.0 / (float)samples) * (fVar3 + fVar3);
}

Assistant:

float Filter::sampleTriangle(float x, float scale, int samples) const
{
	float sum = 0;
	float isamples = 1.0f / float(samples);

	for(int s = 0; s < samples; s++)
	{
		float offset = (2 * float(s) + 1.0f) * isamples;		
		float p = (x + offset - 0.5f) * scale;
		float value = evaluate(p);
		
		float weight = offset;
		if (weight > 1.0f) weight = 2.0f - weight;
		
		sum += value * weight;
	}
	
	return 2 * sum * isamples;
}